

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_data_source_get_length_in_seconds(ma_data_source *pDataSource,float *pLength)

{
  uint local_34;
  ma_uint64 mStack_30;
  ma_uint32 sampleRate;
  ma_uint64 lengthInPCMFrames;
  float *pfStack_20;
  ma_result result;
  float *pLength_local;
  ma_data_source *pDataSource_local;
  
  if (pLength == (float *)0x0) {
    pDataSource_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0.0;
    pfStack_20 = pLength;
    pLength_local = (float *)pDataSource;
    lengthInPCMFrames._4_4_ =
         ma_data_source_get_length_in_pcm_frames(pDataSource,&stack0xffffffffffffffd0);
    pDataSource_local._4_4_ = lengthInPCMFrames._4_4_;
    if ((lengthInPCMFrames._4_4_ == MA_SUCCESS) &&
       (pDataSource_local._4_4_ =
             ma_data_source_get_data_format
                       (pLength_local,(ma_format *)0x0,(ma_uint32 *)0x0,&local_34,(ma_channel *)0x0,
                        0), pDataSource_local._4_4_ == MA_SUCCESS)) {
      *pfStack_20 = (float)(long)mStack_30 / (float)local_34;
      pDataSource_local._4_4_ = MA_SUCCESS;
    }
  }
  return pDataSource_local._4_4_;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_seconds(ma_data_source* pDataSource, float* pLength)
{
    ma_result result;
    ma_uint64 lengthInPCMFrames;
    ma_uint32 sampleRate;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    result = ma_data_source_get_length_in_pcm_frames(pDataSource, &lengthInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pLength = (ma_int64)lengthInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}